

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

wchar_t __thiscall CVmPackPos::getch(CVmPackPos *this)

{
  int iVar1;
  wchar_t wVar2;
  CVmPackPos *in_RDI;
  bool bVar3;
  utf8_ptr *unaff_retaddr;
  CVmPackPos *rem;
  
  rem = in_RDI;
  while( true ) {
    bVar3 = false;
    if (in_RDI->len != 0) {
      utf8_ptr::getch((utf8_ptr *)0x329abf);
      iVar1 = is_space(L'\0');
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    in_RDI->idx = in_RDI->idx + 1;
    utf8_ptr::inc(unaff_retaddr,(size_t *)rem);
  }
  wVar2 = getch_raw(in_RDI);
  return wVar2;
}

Assistant:

wchar_t getch()
    {
        /* skip spaces */
        while (len != 0 && is_space(p.getch()))
        {
            ++idx;
            p.inc(&len);
        }

        /* return the current character */
        return getch_raw();
    }